

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O1

void __thiscall duckdb::PlanEnumerator::SolveJoinOrderApproximately(PlanEnumerator *this)

{
  JoinRelationSet *pJVar1;
  JoinRelationSet *pJVar2;
  PlanEnumerator *this_00;
  _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  reference pvVar3;
  DPJoinNode *pDVar4;
  mapped_type *pmVar5;
  InternalException *this_02;
  reference_wrapper<duckdb::JoinRelationSet> *prVar6;
  iterator __position;
  QueryGraphManager *pQVar7;
  ulong uVar8;
  long lVar9;
  QueryGraphEdges *this_03;
  ulong uVar10;
  idx_t i;
  idx_t index;
  size_type sVar11;
  optional_ptr<duckdb::DPJoinNode,_true> *this_04;
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> join_relations;
  optional_ptr<duckdb::DPJoinNode,_true> best_connection;
  optional_ptr<duckdb::DPJoinNode,_true> smallest_plans [2];
  vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> connection;
  size_t smallest_index [2];
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> local_c8;
  size_type local_b0;
  PlanEnumerator *local_a8;
  optional_ptr<duckdb::DPJoinNode,_true> local_a0;
  optional_ptr<duckdb::DPJoinNode,_true> local_98;
  optional_ptr<duckdb::DPJoinNode,_true> aoStack_90 [2];
  string local_80;
  double local_60;
  ulong local_58 [3];
  _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  ulong local_38;
  
  local_c8.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
  local_c8.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
  local_c8.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (reference_wrapper<duckdb::JoinRelationSet> *)0x0;
  pQVar7 = this->query_graph_manager;
  if ((pQVar7->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar7->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    index = 0;
    do {
      local_80._M_dataplus._M_p =
           (pointer)JoinRelationSetManager::GetJoinRelation(&pQVar7->set_manager,index);
      if (local_c8.
          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_c8.
          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::JoinRelationSet>>
                  ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                    *)&local_c8,
                   (iterator)
                   local_c8.
                   super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (reference_wrapper<duckdb::JoinRelationSet> *)&local_80);
      }
      else {
        (local_c8.
         super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_data =
             (JoinRelationSet *)local_80._M_dataplus._M_p;
        local_c8.
        super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      index = index + 1;
      pQVar7 = this->query_graph_manager;
    } while (index < (ulong)((long)(pQVar7->relation_manager).relations.
                                   super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pQVar7->relation_manager).relations.
                                   super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_a8 = this;
  if (8 < (ulong)((long)local_c8.
                        super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                        .
                        super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    local_40 = (_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->plans;
    do {
      local_a0.ptr = (DPJoinNode *)0x0;
      if (local_c8.
          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_c8.
          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 0;
        local_b0 = 0;
      }
      else {
        local_b0 = 0;
        uVar10 = 0;
        sVar11 = 0;
        do {
          pvVar3 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::operator[]
                             (&local_c8,sVar11);
          uVar8 = sVar11 + 1;
          local_38 = uVar8;
          if (uVar8 < (ulong)((long)local_c8.
                                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_c8.
                                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    .
                                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
            pJVar1 = pvVar3->_M_data;
            do {
              pvVar3 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::operator[]
                                 (&local_c8,uVar8);
              pJVar2 = pvVar3->_M_data;
              QueryGraphEdges::GetConnections
                        ((vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)&local_80,
                         local_a8->query_graph,pJVar1,pJVar2);
              if (local_80._M_dataplus._M_p != (pointer)local_80._M_string_length) {
                pDVar4 = EmitPair(local_a8,pJVar1,pJVar2,
                                  (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)
                                  &local_80);
                if (local_a0.ptr != (DPJoinNode *)0x0) {
                  local_60 = pDVar4->cost;
                  optional_ptr<duckdb::DPJoinNode,_true>::CheckValid(&local_a0);
                  if ((local_a0.ptr)->cost <= local_60) goto LAB_00c7dc17;
                }
                local_a0.ptr = EmitPair(local_a8,pJVar1,pJVar2,
                                        (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true>
                                         *)&local_80);
                uVar10 = uVar8;
                local_b0 = sVar11;
              }
LAB_00c7dc17:
              if ((DPJoinNode *)local_80._M_dataplus._M_p != (DPJoinNode *)0x0) {
                operator_delete(local_80._M_dataplus._M_p);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)((long)local_c8.
                                           super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                           .
                                           super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c8.
                                           super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                           .
                                           super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          sVar11 = local_38;
        } while (local_38 <
                 (ulong)((long)local_c8.
                               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               .
                               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8.
                               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               .
                               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      this_01 = local_40;
      if (local_a0.ptr == (DPJoinNode *)0x0) {
        local_98.ptr = (DPJoinNode *)0x0;
        aoStack_90[0].ptr = (DPJoinNode *)0x0;
        sVar11 = 0;
        do {
          pvVar3 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::operator[]
                             (&local_c8,sVar11);
          pmVar5 = ::std::__detail::
                   _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](this_01,pvVar3);
          (&local_98)[sVar11].ptr =
               (pmVar5->
               super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)._M_t.
               super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>
               .super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
          local_58[sVar11] = sVar11;
          sVar11 = sVar11 + 1;
        } while (sVar11 == 1);
        if (0x10 < (ulong)((long)local_c8.
                                 super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8.
                                super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                .
                                super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          sVar11 = 2;
          do {
            pvVar3 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::operator[]
                               (&local_c8,sVar11);
            pmVar5 = ::std::__detail::
                     _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](this_01,pvVar3);
            local_80._M_dataplus._M_p =
                 (pointer)(pmVar5->
                          super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                          )._M_t.
                          super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>
                          .super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
            lVar9 = 0;
            do {
              if (*(long *)((long)&local_98.ptr + lVar9) == 0) {
LAB_00c7dd41:
                *(pointer *)((long)&local_98.ptr + lVar9) = local_80._M_dataplus._M_p;
                *(size_type *)((long)local_58 + lVar9) = sVar11;
                break;
              }
              this_04 = (optional_ptr<duckdb::DPJoinNode,_true> *)((long)&local_98.ptr + lVar9);
              optional_ptr<duckdb::DPJoinNode,_true>::CheckValid(this_04);
              local_60 = this_04->ptr->cost;
              optional_ptr<duckdb::DPJoinNode,_true>::CheckValid
                        ((optional_ptr<duckdb::DPJoinNode,_true> *)&local_80);
              if (*(double *)(local_80._M_dataplus._M_p + 0x28) <= local_60 &&
                  local_60 != *(double *)(local_80._M_dataplus._M_p + 0x28)) goto LAB_00c7dd41;
              lVar9 = lVar9 + 8;
            } while (lVar9 == 8);
            sVar11 = sVar11 + 1;
          } while (sVar11 < (ulong)((long)local_c8.
                                          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                          .
                                          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_c8.
                                          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                          .
                                          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if ((local_98.ptr == (DPJoinNode *)0x0) || (aoStack_90[0].ptr == (DPJoinNode *)0x0)) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"Internal error in join order optimizer","");
          InternalException::InternalException(this_02,&local_80);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb::DPJoinNode,_true>::CheckValid(&local_98);
        pJVar1 = (local_98.ptr)->set;
        optional_ptr<duckdb::DPJoinNode,_true>::CheckValid(aoStack_90);
        pJVar2 = (aoStack_90[0].ptr)->set;
        this_03 = &local_a8->query_graph_manager->query_graph;
        QueryGraphEdges::CreateEdge
                  (this_03,pJVar1,pJVar2,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
        QueryGraphEdges::CreateEdge
                  (this_03,pJVar2,pJVar1,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
        this_00 = local_a8;
        QueryGraphEdges::GetConnections
                  ((vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)&local_80,
                   local_a8->query_graph,pJVar1,pJVar2);
        local_a0.ptr = EmitPair(this_00,pJVar1,pJVar2,
                                (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)
                                &local_80);
        uVar10 = local_58[1];
        if (local_58[0] >= local_58[1] && local_58[0] != local_58[1]) {
          uVar10 = local_58[0];
        }
        local_b0 = local_58[1];
        if (local_58[0] < local_58[1]) {
          local_b0 = local_58[0];
        }
        if ((DPJoinNode *)local_80._M_dataplus._M_p != (DPJoinNode *)0x0) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      uVar8 = (long)local_c8.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      sVar11 = local_b0;
      if ((uVar8 <= local_b0) || (sVar11 = uVar10, uVar8 <= uVar10)) {
        local_b0 = sVar11;
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   local_b0);
      }
      pDVar4 = (DPJoinNode *)
               JoinRelationSetManager::Union
                         (&local_a8->query_graph_manager->set_manager,
                          local_c8.
                          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_b0]._M_data,
                          local_c8.
                          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_data);
      prVar6 = local_c8.
               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10 + 1;
      if (prVar6 != local_c8.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_c8.
                super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar10,prVar6,
                (long)local_c8.
                      super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)prVar6);
      }
      local_c8.
      super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_c8.
           super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      prVar6 = local_c8.
               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_b0 + 1;
      if (prVar6 != local_c8.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_c8.
                super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_b0,prVar6,
                (long)local_c8.
                      super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)prVar6);
      }
      __position._M_current =
           local_c8.
           super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_80._M_dataplus._M_p = (pointer)pDVar4;
      if (__position._M_current ==
          local_c8.
          super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_c8.
        super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
        ::std::
        vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::JoinRelationSet>>
                  ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                    *)&local_c8,__position,(reference_wrapper<duckdb::JoinRelationSet> *)&local_80);
      }
      else {
        (__position._M_current)->_M_data = (JoinRelationSet *)pDVar4;
      }
    } while (8 < (ulong)((long)local_c8.
                               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               .
                               super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_c8.
                              super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              ._M_impl.super__Vector_impl_data._M_start));
  }
  if (local_c8.
      super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (reference_wrapper<duckdb::JoinRelationSet> *)0x0
     ) {
    operator_delete(local_c8.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PlanEnumerator::SolveJoinOrderApproximately() {
	// at this point, we exited the dynamic programming but did not compute the final join order because it took too
	// long instead, we use a greedy heuristic to obtain a join ordering now we use Greedy Operator Ordering to
	// construct the result tree first we start out with all the base relations (the to-be-joined relations)
	vector<reference<JoinRelationSet>> join_relations; // T in the paper
	for (idx_t i = 0; i < query_graph_manager.relation_manager.NumRelations(); i++) {
		join_relations.push_back(query_graph_manager.set_manager.GetJoinRelation(i));
	}
	while (join_relations.size() > 1) {
		// now in every step of the algorithm, we greedily pick the join between the to-be-joined relations that has the
		// smallest cost. This is O(r^2) per step, and every step will reduce the total amount of relations to-be-joined
		// by 1, so the total cost is O(r^3) in the amount of relations
		// long is needed to prevent clang-tidy complaints. (idx_t) cannot be added to an iterator position because it
		// is unsigned.
		idx_t best_left = 0, best_right = 0;
		optional_ptr<DPJoinNode> best_connection;
		for (idx_t i = 0; i < join_relations.size(); i++) {
			auto left = join_relations[i];
			for (idx_t j = i + 1; j < join_relations.size(); j++) {
				auto right = join_relations[j];
				// check if we can connect these two relations
				auto connection = query_graph.GetConnections(left, right);
				if (!connection.empty()) {
					// we can check the cost of this connection
					auto node = EmitPair(left, right, connection);

					// update the DP tree in case a plan created by the DP algorithm uses the node
					// that was potentially just updated by EmitPair. You will get a use-after-free
					// error if future plans rely on the old node that was just replaced.
					// if node in FullPath, then updateDP tree.

					if (!best_connection || node.cost < best_connection->cost) {
						// best pair found so far
						best_connection = &EmitPair(left, right, connection);
						best_left = i;
						best_right = j;
					}
				}
			}
		}
		if (!best_connection) {
			// could not find a connection, but we were not done with finding a completed plan
			// we have to add a cross product; we add it between the two smallest relations
			optional_ptr<DPJoinNode> smallest_plans[2];
			size_t smallest_index[2];
			D_ASSERT(join_relations.size() >= 2);

			// first just add the first two join relations. It doesn't matter the cost as the JOO
			// will swap them on estimated cardinality anyway.
			for (idx_t i = 0; i < 2; i++) {
				optional_ptr<DPJoinNode> current_plan = plans[join_relations[i]];
				smallest_plans[i] = current_plan;
				smallest_index[i] = i;
			}

			// if there are any other join relations that don't have connections
			// add them if they have lower estimated cardinality.
			for (idx_t i = 2; i < join_relations.size(); i++) {
				// get the plan for this relation
				optional_ptr<DPJoinNode> current_plan = plans[join_relations[i]];
				// check if the cardinality is smaller than the smallest two found so far
				for (idx_t j = 0; j < 2; j++) {
					if (!smallest_plans[j] || smallest_plans[j]->cost > current_plan->cost) {
						smallest_plans[j] = current_plan;
						smallest_index[j] = i;
						break;
					}
				}
			}
			if (!smallest_plans[0] || !smallest_plans[1]) {
				throw InternalException("Internal error in join order optimizer");
			}
			D_ASSERT(smallest_plans[0] && smallest_plans[1]);
			D_ASSERT(smallest_index[0] != smallest_index[1]);
			auto &left = smallest_plans[0]->set;
			auto &right = smallest_plans[1]->set;
			// create a cross product edge (i.e. edge with empty filter) between these two sets in the query graph
			query_graph_manager.CreateQueryGraphCrossProduct(left, right);
			// now emit the pair and continue with the algorithm
			auto connections = query_graph.GetConnections(left, right);
			D_ASSERT(!connections.empty());

			best_connection = &EmitPair(left, right, connections);
			best_left = smallest_index[0];
			best_right = smallest_index[1];

			// the code below assumes best_right > best_left
			if (best_left > best_right) {
				std::swap(best_left, best_right);
			}
		}
		// now update the to-be-checked pairs
		// remove left and right, and add the combination

		// important to erase the biggest element first
		// if we erase the smallest element first the index of the biggest element changes
		auto &new_set = query_graph_manager.set_manager.Union(join_relations.at(best_left).get(),
		                                                      join_relations.at(best_right).get());
		D_ASSERT(best_right > best_left);
		join_relations.erase(join_relations.begin() + (int64_t)best_right);
		join_relations.erase(join_relations.begin() + (int64_t)best_left);
		join_relations.push_back(new_set);
	}
}